

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O0

int acmod_process_raw(acmod_t *acmod,int16 **inout_raw,size_t *inout_n_samps,int full_utt)

{
  int iVar1;
  int local_40;
  int local_3c;
  int32 ncep1;
  int inptr;
  int16 *prev_audio_inptr;
  int32 ncep;
  int full_utt_local;
  size_t *inout_n_samps_local;
  int16 **inout_raw_local;
  acmod_t *acmod_local;
  
  _ncep = inout_n_samps;
  inout_n_samps_local = (size_t *)inout_raw;
  inout_raw_local = (int16 **)acmod;
  if (full_utt == 0) {
    prev_audio_inptr._4_4_ = 0;
    if ((inout_n_samps != (size_t *)0x0) && (*inout_n_samps != 0)) {
      _ncep1 = *inout_raw;
      prev_audio_inptr._0_4_ = acmod->n_mfc_alloc - acmod->n_mfc_frame;
      local_3c = (acmod->mfc_outidx + acmod->n_mfc_frame) % acmod->n_mfc_alloc;
      do {
        if (local_3c + (int)prev_audio_inptr <= *(int *)(inout_raw_local + 0x16)) {
          if (*(int *)(inout_raw_local + 0x16) < local_3c + (int)prev_audio_inptr) {
            __assert_fail("inptr + ncep <= acmod->n_mfc_alloc",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                          ,0x28b,"int acmod_process_raw(acmod_t *, const int16 **, size_t *, int)");
          }
          iVar1 = fe_process_frames((fe_t *)inout_raw_local[3],(int16 **)inout_n_samps_local,_ncep,
                                    (mfcc_t **)(inout_raw_local[0xe] + (long)local_3c * 4),
                                    (int32 *)&prev_audio_inptr);
          if (iVar1 < 0) {
            return -1;
          }
          if (inout_raw_local[0x10] != (int16 *)0x0) {
            fwrite(_ncep1,2,(long)(*inout_n_samps_local - (long)_ncep1) >> 1,
                   (FILE *)inout_raw_local[0x10]);
            _ncep1 = (int16 *)*inout_n_samps_local;
          }
          *(int *)((long)inout_raw_local + 0xb4) =
               (int)prev_audio_inptr + *(int *)((long)inout_raw_local + 0xb4);
          break;
        }
        local_40 = *(int *)(inout_raw_local + 0x16) - local_3c;
        iVar1 = fe_process_frames((fe_t *)inout_raw_local[3],(int16 **)inout_n_samps_local,_ncep,
                                  (mfcc_t **)(inout_raw_local[0xe] + (long)local_3c * 4),&local_40);
        if (iVar1 < 0) {
          return -1;
        }
        if (inout_raw_local[0x10] != (int16 *)0x0) {
          fwrite(_ncep1,2,(long)(*inout_n_samps_local - (long)_ncep1) >> 1,
                 (FILE *)inout_raw_local[0x10]);
          _ncep1 = (int16 *)*inout_n_samps_local;
        }
        *(int *)((long)inout_raw_local + 0xb4) = local_40 + *(int *)((long)inout_raw_local + 0xb4);
        prev_audio_inptr._0_4_ = (int)prev_audio_inptr - local_40;
        local_3c = (local_40 + local_3c) % *(int *)(inout_raw_local + 0x16);
      } while (local_40 != 0);
    }
    acmod_local._4_4_ = acmod_process_mfcbuf((acmod_t *)inout_raw_local);
  }
  else {
    prev_audio_inptr._4_4_ = full_utt;
    acmod_local._4_4_ = acmod_process_full_raw(acmod,inout_raw,inout_n_samps);
  }
  return acmod_local._4_4_;
}

Assistant:

int
acmod_process_raw(acmod_t *acmod,
                  int16 const **inout_raw,
                  size_t *inout_n_samps,
                  int full_utt)
{
    int32 ncep;

    /* If this is a full utterance, process it all at once. */
    if (full_utt)
        return acmod_process_full_raw(acmod, inout_raw, inout_n_samps);

    /* Append MFCCs to the end of any that are previously in there
     * (in practice, there will probably be none) */
    if (inout_n_samps && *inout_n_samps) {
        int16 const *prev_audio_inptr = *inout_raw;
        int inptr;

        /* Total number of frames available. */
        ncep = acmod->n_mfc_alloc - acmod->n_mfc_frame;
        /* Where to start writing them (circular buffer) */
        inptr = (acmod->mfc_outidx + acmod->n_mfc_frame) % acmod->n_mfc_alloc;

        /* Write them in two (or more) parts if there is wraparound. */
        while (inptr + ncep > acmod->n_mfc_alloc) {
            int32 ncep1 = acmod->n_mfc_alloc - inptr;
            if (fe_process_frames(acmod->fe, inout_raw, inout_n_samps,
                                  acmod->mfc_buf + inptr, &ncep1) < 0)
                return -1;
            /* Write to logging file if any. */
            if (acmod->rawfh) {
                fwrite(prev_audio_inptr, 2,
                       *inout_raw - prev_audio_inptr,
                       acmod->rawfh);
                prev_audio_inptr = *inout_raw;
            }
            /* ncep1 now contains the number of frames actually
             * processed.  This is a good thing, but it means we
             * actually still might have some room left at the end of
             * the buffer, hence the while loop.  Unfortunately it
             * also means that in the case where we are really
             * actually done, we need to get out totally, hence the
             * goto. */
            acmod->n_mfc_frame += ncep1;
            ncep -= ncep1;
            inptr += ncep1;
            inptr %= acmod->n_mfc_alloc;
            if (ncep1 == 0)
        	goto alldone;
        }
        assert(inptr + ncep <= acmod->n_mfc_alloc);
        if (fe_process_frames(acmod->fe, inout_raw, inout_n_samps,
                              acmod->mfc_buf + inptr, &ncep) < 0)
            return -1;
        /* Write to logging file if any. */
        if (acmod->rawfh) {
            fwrite(prev_audio_inptr, 2,
                   *inout_raw - prev_audio_inptr, acmod->rawfh);
            prev_audio_inptr = *inout_raw;
        }
        acmod->n_mfc_frame += ncep;
    alldone:
        ;
    }

    /* Hand things off to acmod_process_cep. */
    return acmod_process_mfcbuf(acmod);
}